

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# small_vector.h
# Opt level: O3

void __thiscall
wasm::
SmallVector<wasm::Walker<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,wasm::UnifiedExpressionVisitor<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,void>>::Task,10ul>
::
emplace_back<void(*&)((anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper*,wasm::Expression**),wasm::Expression**&>
          (SmallVector<wasm::Walker<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,wasm::UnifiedExpressionVisitor<(anonymous_namespace)::updateNames(wasm::Module&,std::unordered_map<wasm::ModuleItemKind,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>,std::hash<wasm::ModuleItemKind>,std::equal_to<wasm::ModuleItemKind>,std::allocator<std::pair<wasm::ModuleItemKind_const,std::unordered_map<wasm::Name,wasm::Name,std::hash<wasm::Name>,std::equal_to<wasm::Name>,std::allocator<std::pair<wasm::Name_const,wasm::Name>>>>>>&)::NameMapper,void>>::Task,10ul>
           *this,_func_void_NameMapper_ptr_Expression_ptr_ptr **Args,Expression ***Args_1)

{
  Expression **ppEVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  undefined8 uVar4;
  ulong uVar5;
  undefined8 *puVar6;
  undefined8 *puVar7;
  ulong uVar8;
  ulong uVar9;
  undefined8 *puVar10;
  long lVar11;
  
  uVar8 = *(ulong *)this;
  if (uVar8 < 10) {
    *(ulong *)this = uVar8 + 1;
    ppEVar1 = *Args_1;
    *(_func_void_NameMapper_ptr_Expression_ptr_ptr **)(this + uVar8 * 0x10 + 8) = *Args;
    *(Expression ***)(this + uVar8 * 0x10 + 0x10) = ppEVar1;
  }
  else {
    puVar2 = *(undefined8 **)(this + 0xb0);
    if (puVar2 == *(undefined8 **)(this + 0xb8)) {
      puVar3 = *(undefined8 **)(this + 0xa8);
      lVar11 = (long)puVar2 - (long)puVar3;
      if (lVar11 == 0x7ffffffffffffff0) {
        std::__throw_length_error("vector::_M_realloc_insert");
      }
      uVar5 = lVar11 >> 4;
      uVar8 = 1;
      if (puVar2 != puVar3) {
        uVar8 = uVar5;
      }
      uVar9 = uVar8 + uVar5;
      if (0x7fffffffffffffe < uVar9) {
        uVar9 = 0x7ffffffffffffff;
      }
      if (CARRY8(uVar8,uVar5)) {
        uVar9 = 0x7ffffffffffffff;
      }
      puVar6 = (undefined8 *)operator_new(uVar9 * 0x10);
      ppEVar1 = *Args_1;
      *(_func_void_NameMapper_ptr_Expression_ptr_ptr **)((long)puVar6 + lVar11) = *Args;
      *(Expression ***)((long)puVar6 + lVar11 + 8) = ppEVar1;
      puVar10 = puVar6;
      for (puVar7 = puVar3; puVar2 != puVar7; puVar7 = puVar7 + 2) {
        uVar4 = puVar7[1];
        *puVar10 = *puVar7;
        puVar10[1] = uVar4;
        puVar10 = puVar10 + 2;
      }
      if (puVar3 != (undefined8 *)0x0) {
        operator_delete(puVar3,*(long *)(this + 0xb8) - (long)puVar3);
      }
      *(undefined8 **)(this + 0xa8) = puVar6;
      *(undefined8 **)(this + 0xb0) = puVar10 + 2;
      *(undefined8 **)(this + 0xb8) = puVar6 + uVar9 * 2;
    }
    else {
      ppEVar1 = *Args_1;
      *puVar2 = *Args;
      puVar2[1] = ppEVar1;
      *(undefined8 **)(this + 0xb0) = puVar2 + 2;
    }
  }
  return;
}

Assistant:

void emplace_back(ArgTypes&&... Args) {
    if (usedFixed < N) {
      new (&fixed[usedFixed++]) T(std::forward<ArgTypes>(Args)...);
    } else {
      flexible.emplace_back(std::forward<ArgTypes>(Args)...);
    }
  }